

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsGenerator.cxx
# Opt level: O0

bool __thiscall
kws::Generator::GenerateDart
          (Generator *this,char *dir,int maxError,bool group,string *url,double time,
          string *basedirectory)

{
  char *pcVar1;
  byte bVar2;
  bool bVar3;
  _Ios_Openmode _Var4;
  size_t sVar5;
  ostream *poVar6;
  char *pcVar7;
  long lVar8;
  ulong uVar9;
  reference this_00;
  reference pEVar10;
  byte in_CL;
  int in_EDX;
  char *in_RSI;
  long in_RDI;
  double in_XMM0_Qa;
  double dVar11;
  char *timestr;
  size_t length;
  double time1;
  char *val;
  size_t length_1;
  long pos;
  string desc;
  uint i;
  long slash;
  long pos_2;
  long pos_1;
  string htmlfile;
  const_iterator itError;
  ErrorVectorType errors;
  bool first;
  string sourcefile;
  const_iterator it;
  int nErrors;
  string currentLine;
  char *buffer;
  string filename;
  ofstream file;
  ifstream configfile;
  string configname;
  char *bufferTag;
  ifstream tagfile;
  string tag;
  string dirname;
  Parser *in_stack_fffffffffffff408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff410;
  Parser *in_stack_fffffffffffff418;
  vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_> *in_stack_fffffffffffff420;
  char *in_stack_fffffffffffff430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff438;
  unsigned_long in_stack_fffffffffffff440;
  Parser *in_stack_fffffffffffff448;
  vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_> *in_stack_fffffffffffff458;
  ostream *in_stack_fffffffffffff460;
  string local_958 [32];
  Parser *local_938;
  ErrorStruct *local_930;
  char *local_928;
  undefined8 local_920;
  string local_918 [32];
  string local_8f8 [32];
  string local_8d8 [32];
  ulong local_8b8;
  string local_8b0 [32];
  string local_890 [32];
  string local_870 [36];
  uint local_84c;
  ulong local_848;
  string local_840 [32];
  ulong local_820;
  string local_818 [32];
  ulong local_7f8;
  string local_7f0 [32];
  ErrorStruct *local_7d0;
  __normal_iterator<const_kws::ErrorStruct_*,_std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>
  local_7c8 [4];
  undefined7 in_stack_fffffffffffff858;
  byte in_stack_fffffffffffff85f;
  string local_7a0 [32];
  string local_780 [32];
  Parser *local_760;
  Parser *local_758;
  __normal_iterator<const_kws::Parser_*,_std::vector<kws::Parser,_std::allocator<kws::Parser>_>_>
  local_750;
  int local_744;
  string local_740 [39];
  allocator local_719;
  string local_718 [32];
  char *local_6f8;
  string local_6f0 [32];
  ostream local_6d0 [512];
  char local_4d0 [520];
  string local_2c8 [32];
  char *local_2a8;
  int local_29c;
  char local_298 [520];
  string local_90 [55];
  allocator local_59;
  string local_58 [40];
  double local_30;
  byte local_1d;
  int local_1c;
  char *local_18;
  byte local_1;
  
  local_1d = in_CL & 1;
  local_30 = in_XMM0_Qa;
  local_1c = in_EDX;
  local_18 = in_RSI;
  std::operator<<((ostream *)&std::cout,"Generating Dart...");
  pcVar7 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,pcVar7,&local_59);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  pcVar7 = local_18;
  sVar5 = strlen(local_18);
  if ((pcVar7[sVar5 - 1] != '/') && (sVar5 = strlen(local_18), local_18[sVar5 - 1] != '\\')) {
    std::__cxx11::string::operator+=(local_58,"/");
  }
  std::__cxx11::string::operator+=(local_58,"Testing/");
  std::operator+(in_stack_fffffffffffff438,in_stack_fffffffffffff430);
  std::ifstream::ifstream(local_298);
  _Var4 = std::__cxx11::string::c_str();
  std::operator|(_S_bin,_S_in);
  std::ifstream::open(local_298,_Var4);
  bVar2 = std::ifstream::is_open();
  if ((bVar2 & 1) == 0) {
    poVar6 = std::operator<<((ostream *)&std::cout,"Cannot open file for reading: ");
    pcVar7 = (char *)std::__cxx11::string::c_str();
    poVar6 = std::operator<<(poVar6,pcVar7);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    local_1 = 0;
    local_29c = 1;
  }
  else {
    local_2a8 = (char *)operator_new__(0xff);
    std::istream::getline(local_298,(long)local_2a8);
    pcVar7 = local_2a8;
    sVar5 = strlen(local_2a8);
    pcVar1 = local_2a8;
    if (pcVar7[sVar5 - 1] == '\r') {
      sVar5 = strlen(local_2a8);
      pcVar1[sVar5 - 1] = '\0';
    }
    std::__cxx11::string::operator+=(local_58,local_2a8);
    std::__cxx11::string::operator+=(local_58,"/");
    if (local_2a8 != (char *)0x0) {
      operator_delete__(local_2a8);
    }
    std::operator+(in_stack_fffffffffffff438,in_stack_fffffffffffff430);
    std::ifstream::ifstream(local_4d0);
    _Var4 = std::__cxx11::string::c_str();
    std::operator|(_S_bin,_S_in);
    std::ifstream::open(local_4d0,_Var4);
    bVar2 = std::ifstream::is_open();
    if ((bVar2 & 1) == 0) {
      poVar6 = std::operator<<((ostream *)&std::cout,"Cannot open file for reading: ");
      pcVar7 = (char *)std::__cxx11::string::c_str();
      poVar6 = std::operator<<(poVar6,pcVar7);
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      local_1 = 0;
      local_29c = 1;
    }
    else {
      std::ofstream::ofstream(local_6d0);
      std::operator+(in_stack_fffffffffffff438,in_stack_fffffffffffff430);
      _Var4 = std::__cxx11::string::c_str();
      std::operator|(_S_bin,_S_out);
      std::ofstream::open((char *)local_6d0,_Var4);
      bVar2 = std::ofstream::is_open();
      if ((bVar2 & 1) == 0) {
        poVar6 = std::operator<<((ostream *)&std::cout,"Cannot open file for writing: ");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        local_1 = 0;
        local_29c = 1;
      }
      else {
        local_6f8 = (char *)operator_new__(0xff);
        std::istream::getline(local_4d0,(long)local_6f8);
        poVar6 = std::operator<<(local_6d0,local_6f8);
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        std::istream::getline(local_4d0,(long)local_6f8);
        poVar6 = std::operator<<(local_6d0,local_6f8);
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        pcVar7 = local_6f8;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_718,pcVar7,&local_719);
        std::allocator<char>::~allocator((allocator<char> *)&local_719);
        while (lVar8 = std::__cxx11::string::find((char *)local_718,0x1e512a), lVar8 == -1) {
          std::istream::getline(local_4d0,(long)local_6f8);
          std::__cxx11::string::operator=(local_718,local_6f8);
          poVar6 = std::operator<<(local_6d0,local_6f8);
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        }
        if (local_6f8 != (char *)0x0) {
          operator_delete__(local_6f8);
        }
        poVar6 = std::operator<<(local_6d0,"<Build>");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        std::operator<<(local_6d0,"      <StartDateTime>");
        kwssys::SystemTools::GetCurrentDateTime_abi_cxx11_
                  ((char *)CONCAT17(in_stack_fffffffffffff85f,in_stack_fffffffffffff858));
        std::operator<<(local_6d0,local_740);
        std::__cxx11::string::~string(local_740);
        poVar6 = std::operator<<(local_6d0,"</StartDateTime>");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        std::operator<<(local_6d0,"      <StartBuildTime>");
        dVar11 = kwssys::SystemTools::GetTime();
        std::ostream::operator<<(local_6d0,(uint)(long)dVar11);
        poVar6 = std::operator<<(local_6d0,"</StartBuildTime>");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        poVar6 = std::operator<<(local_6d0,"<BuildCommand>KWStyle</BuildCommand>");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        local_744 = 0;
        local_758 = (Parser *)
                    std::vector<kws::Parser,_std::allocator<kws::Parser>_>::begin
                              ((vector<kws::Parser,_std::allocator<kws::Parser>_> *)
                               in_stack_fffffffffffff408);
        __gnu_cxx::
        __normal_iterator<kws::Parser_const*,std::vector<kws::Parser,std::allocator<kws::Parser>>>::
        __normal_iterator<kws::Parser*>
                  ((__normal_iterator<const_kws::Parser_*,_std::vector<kws::Parser,_std::allocator<kws::Parser>_>_>
                    *)in_stack_fffffffffffff410,
                   (__normal_iterator<kws::Parser_*,_std::vector<kws::Parser,_std::allocator<kws::Parser>_>_>
                    *)in_stack_fffffffffffff408);
        do {
          local_760 = (Parser *)
                      std::vector<kws::Parser,_std::allocator<kws::Parser>_>::end
                                ((vector<kws::Parser,_std::allocator<kws::Parser>_> *)
                                 in_stack_fffffffffffff408);
          bVar3 = __gnu_cxx::operator!=
                            ((__normal_iterator<const_kws::Parser_*,_std::vector<kws::Parser,_std::allocator<kws::Parser>_>_>
                              *)in_stack_fffffffffffff410,
                             (__normal_iterator<kws::Parser_*,_std::vector<kws::Parser,_std::allocator<kws::Parser>_>_>
                              *)in_stack_fffffffffffff408);
          if (!bVar3) break;
          __gnu_cxx::
          __normal_iterator<const_kws::Parser_*,_std::vector<kws::Parser,_std::allocator<kws::Parser>_>_>
          ::operator*(&local_750);
          Parser::GetFilename_abi_cxx11_(in_stack_fffffffffffff408);
          uVar9 = std::__cxx11::string::empty();
          if ((uVar9 & 1) == 0) {
            std::__cxx11::string::size();
            std::__cxx11::string::substr((ulong)local_7a0,(ulong)local_780);
            std::__cxx11::string::operator=(local_780,local_7a0);
            std::__cxx11::string::~string(local_7a0);
          }
          in_stack_fffffffffffff85f = 1;
          this_00 = __gnu_cxx::
                    __normal_iterator<const_kws::Parser_*,_std::vector<kws::Parser,_std::allocator<kws::Parser>_>_>
                    ::operator*(&local_750);
          Parser::GetErrors(this_00);
          std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::vector
                    ((vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_> *)
                     in_stack_fffffffffffff460,in_stack_fffffffffffff458);
          local_7c8[0]._M_current =
               (ErrorStruct *)
               std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::begin
                         (&in_stack_fffffffffffff408->m_ErrorList);
          do {
            local_7d0 = (ErrorStruct *)
                        std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::end
                                  (&in_stack_fffffffffffff408->m_ErrorList);
            bVar3 = __gnu_cxx::operator!=
                              ((__normal_iterator<const_kws::ErrorStruct_*,_std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>
                                *)in_stack_fffffffffffff410,
                               (__normal_iterator<const_kws::ErrorStruct_*,_std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>
                                *)in_stack_fffffffffffff408);
            if (!bVar3) break;
            if (((local_1d & 1) == 0) ||
               (((in_stack_fffffffffffff85f & 1) != 0 && ((local_1d & 1) != 0)))) {
              poVar6 = std::operator<<(local_6d0,"<Error>");
              std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
              poVar6 = std::operator<<(local_6d0,"          <BuildLogLine>1</BuildLogLine>");
              std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
              std::operator<<(local_6d0,"          <SourceFile>");
              pcVar7 = (char *)std::__cxx11::string::c_str();
              std::operator<<(local_6d0,pcVar7);
              poVar6 = std::operator<<(local_6d0,"</SourceFile>");
              std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
              std::operator<<(local_6d0,"          <SourceLineNumber>");
              pEVar10 = __gnu_cxx::
                        __normal_iterator<const_kws::ErrorStruct_*,_std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>
                        ::operator*(local_7c8);
              std::ostream::operator<<(local_6d0,pEVar10->line);
              poVar6 = std::operator<<(local_6d0,"</SourceLineNumber>");
              std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
              uVar9 = std::__cxx11::string::empty();
              if ((uVar9 & 1) == 0) {
                __gnu_cxx::
                __normal_iterator<const_kws::Parser_*,_std::vector<kws::Parser,_std::allocator<kws::Parser>_>_>
                ::operator*(&local_750);
                Parser::GetFilename_abi_cxx11_(in_stack_fffffffffffff408);
                lVar8 = std::__cxx11::string::find((char *)local_7f0,0x1e6eea);
                local_7f8 = (ulong)(lVar8 != -1);
                if (local_7f8 != 0) {
                  std::__cxx11::string::size();
                  std::__cxx11::string::substr((ulong)local_818,(ulong)local_7f0);
                  std::__cxx11::string::operator=(local_7f0,local_818);
                  std::__cxx11::string::~string(local_818);
                }
                lVar8 = std::__cxx11::string::find((char *)local_7f0,0x1e4bcc);
                local_820 = (ulong)(lVar8 != -1);
                if (local_820 != 0) {
                  std::__cxx11::string::size();
                  std::__cxx11::string::substr((ulong)local_840,(ulong)local_7f0);
                  std::__cxx11::string::operator=(local_7f0,local_840);
                  std::__cxx11::string::~string(local_840);
                }
                local_848 = std::__cxx11::string::find_last_of((char *)local_7f0,0x1d8c59);
                local_84c = 0;
                while( true ) {
                  bVar3 = false;
                  if (local_848 != 0xffffffffffffffff) {
                    bVar3 = local_84c < *(uint *)(in_RDI + 0x68);
                  }
                  if (!bVar3) break;
                  std::__cxx11::string::replace((ulong)local_7f0,local_848,(char *)0x1);
                  local_848 = std::__cxx11::string::find_last_of((char *)local_7f0,0x1d8c59);
                  local_84c = local_84c + 1;
                }
                local_848 = std::__cxx11::string::find_last_of((char *)local_7f0,0x1d8c59);
                if (local_848 != -1) {
                  std::__cxx11::string::size();
                  std::__cxx11::string::substr((ulong)local_870,(ulong)local_7f0);
                  std::__cxx11::string::operator=(local_7f0,local_870);
                  std::__cxx11::string::~string(local_870);
                }
                std::__cxx11::string::operator+=(local_7f0,".html");
                poVar6 = std::operator<<(local_6d0,"<Url>");
                pcVar7 = (char *)std::__cxx11::string::c_str();
                poVar6 = std::operator<<(poVar6,pcVar7);
                poVar6 = std::operator<<(poVar6,"/");
                pcVar7 = (char *)std::__cxx11::string::c_str();
                poVar6 = std::operator<<(poVar6,pcVar7);
                poVar6 = std::operator<<(poVar6,"</Url>");
                std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
                poVar6 = std::operator<<(local_6d0,"<UrlName>View KWStyle File</UrlName>");
                std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
                std::__cxx11::string::~string(local_7f0);
              }
              in_stack_fffffffffffff85f = 0;
              std::operator<<(local_6d0,"          <Text>");
            }
            pcVar7 = (char *)std::__cxx11::string::c_str();
            std::operator<<(local_6d0,pcVar7);
            std::operator<<(local_6d0," : ");
            __gnu_cxx::
            __normal_iterator<const_kws::Parser_*,_std::vector<kws::Parser,_std::allocator<kws::Parser>_>_>
            ::operator*(&local_750);
            __gnu_cxx::
            __normal_iterator<const_kws::ErrorStruct_*,_std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>
            ::operator*(local_7c8);
            Parser::GetErrorTag_abi_cxx11_(in_stack_fffffffffffff448,in_stack_fffffffffffff440);
            std::operator<<(local_6d0,local_890);
            std::__cxx11::string::~string(local_890);
            std::operator<<(local_6d0," : ");
            pEVar10 = __gnu_cxx::
                      __normal_iterator<const_kws::ErrorStruct_*,_std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>
                      ::operator*(local_7c8);
            std::__cxx11::string::string(local_8b0,(string *)&pEVar10->description);
            local_8b8 = std::__cxx11::string::find((char *)local_8b0,0x1e54b0);
            while (local_8b8 != 0xffffffffffffffff) {
              std::__cxx11::string::replace((ulong)local_8b0,local_8b8,(char *)0x1);
              local_8b8 = std::__cxx11::string::find((char *)local_8b0,0x1e54b0);
            }
            local_8b8 = std::__cxx11::string::find((char *)local_8b0,0x1e5c08);
            while (local_8b8 != 0xffffffffffffffff) {
              std::__cxx11::string::replace((ulong)local_8b0,local_8b8,(char *)0x1);
              local_8b8 = std::__cxx11::string::find((char *)local_8b0,0x1e5c08);
            }
            local_8b8 = std::__cxx11::string::find((char *)local_8b0,0x1e512a);
            while (local_8b8 != 0xffffffffffffffff) {
              std::__cxx11::string::replace((ulong)local_8b0,local_8b8,(char *)0x1);
              local_8b8 = std::__cxx11::string::find((char *)local_8b0,0x1e512a);
            }
            __gnu_cxx::
            __normal_iterator<const_kws::Parser_*,_std::vector<kws::Parser,_std::allocator<kws::Parser>_>_>
            ::operator*(&local_750);
            __gnu_cxx::
            __normal_iterator<const_kws::ErrorStruct_*,_std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>
            ::operator*(local_7c8);
            Parser::GetTestDescription_abi_cxx11_
                      (in_stack_fffffffffffff418,(size_t)in_stack_fffffffffffff410);
            std::operator+((char *)in_stack_fffffffffffff418,in_stack_fffffffffffff410);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff418,(char *)in_stack_fffffffffffff410);
            std::__cxx11::string::operator+=(local_8b0,local_8d8);
            std::__cxx11::string::~string(local_8d8);
            std::__cxx11::string::~string(local_8f8);
            std::__cxx11::string::~string(local_918);
            local_920 = 0xff;
            pcVar7 = (char *)operator_new__(0xff);
            local_928 = pcVar7;
            pEVar10 = __gnu_cxx::
                      __normal_iterator<const_kws::ErrorStruct_*,_std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>
                      ::operator*(local_7c8);
            snprintf(pcVar7,0xff,"%ld",pEVar10->line);
            std::__cxx11::string::operator+=(local_8b0,local_928);
            std::__cxx11::string::operator+=(local_8b0,")\n");
            if (local_928 != (char *)0x0) {
              operator_delete__(local_928);
            }
            std::operator<<(local_6d0,local_8b0);
            if ((local_1d & 1) == 0) {
              poVar6 = std::operator<<(local_6d0,"</Text>");
              std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
              std::operator<<(local_6d0,"          <PreContext>");
              poVar6 = std::operator<<(local_6d0,"</PreContext>");
              std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
              std::operator<<(local_6d0,"<PostContext>");
              poVar6 = std::operator<<(local_6d0,"</PostContext>");
              std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
              poVar6 = std::operator<<(local_6d0,"<RepeatCount>0</RepeatCount>");
              std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
              poVar6 = std::operator<<(local_6d0,"</Error>");
              std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            }
            local_930 = (ErrorStruct *)
                        __gnu_cxx::
                        __normal_iterator<const_kws::ErrorStruct_*,_std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>
                        ::operator++((__normal_iterator<const_kws::ErrorStruct_*,_std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>
                                      *)in_stack_fffffffffffff418,
                                     (int)((ulong)in_stack_fffffffffffff410 >> 0x20));
            local_744 = local_744 + 1;
            if ((local_1c == -1) || (local_744 < local_1c)) {
              local_29c = 0;
            }
            else {
              local_29c = 7;
            }
            std::__cxx11::string::~string(local_8b0);
          } while (local_29c == 0);
          if (((local_1d & 1) != 0) && ((in_stack_fffffffffffff85f & 1) == 0)) {
            poVar6 = std::operator<<(local_6d0,"</Text>");
            std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            std::operator<<(local_6d0,"          <PreContext>");
            poVar6 = std::operator<<(local_6d0,"</PreContext>");
            std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            std::operator<<(local_6d0,"<PostContext>");
            poVar6 = std::operator<<(local_6d0,"</PostContext>");
            std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            poVar6 = std::operator<<(local_6d0,"<RepeatCount>0</RepeatCount>");
            std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            in_stack_fffffffffffff460 = std::operator<<(local_6d0,"</Error>");
            std::ostream::operator<<
                      (in_stack_fffffffffffff460,std::endl<char,std::char_traits<char>>);
          }
          if ((local_1c == -1) || (local_744 < local_1c)) {
            local_938 = (Parser *)
                        __gnu_cxx::
                        __normal_iterator<const_kws::Parser_*,_std::vector<kws::Parser,_std::allocator<kws::Parser>_>_>
                        ::operator++((__normal_iterator<const_kws::Parser_*,_std::vector<kws::Parser,_std::allocator<kws::Parser>_>_>
                                      *)in_stack_fffffffffffff418,
                                     (int)((ulong)in_stack_fffffffffffff410 >> 0x20));
            local_29c = 0;
          }
          else {
            local_29c = 5;
          }
          std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::~vector
                    (in_stack_fffffffffffff420);
          std::__cxx11::string::~string(local_780);
        } while (local_29c == 0);
        poVar6 = std::operator<<(local_6d0," <Log Encoding=\"base64\" Compression=\"/bin/gzip\">");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        poVar6 = std::operator<<(local_6d0,"      </Log>");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        std::operator<<(local_6d0,"      <EndDateTime>");
        kwssys::SystemTools::GetCurrentDateTime_abi_cxx11_
                  ((char *)CONCAT17(in_stack_fffffffffffff85f,in_stack_fffffffffffff858));
        std::operator<<(local_6d0,local_958);
        std::__cxx11::string::~string(local_958);
        poVar6 = std::operator<<(local_6d0,"</EndDateTime>");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        dVar11 = kwssys::SystemTools::GetTime();
        pcVar7 = (char *)operator_new__(10);
        snprintf(pcVar7,10,"%.1f",(dVar11 - local_30) / 60.0);
        poVar6 = std::operator<<(local_6d0,"  <ElapsedMinutes>");
        poVar6 = std::operator<<(poVar6,pcVar7);
        poVar6 = std::operator<<(poVar6,"</ElapsedMinutes></Build>");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        poVar6 = std::operator<<(local_6d0,"</Site>");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        if (pcVar7 != (char *)0x0) {
          operator_delete__(pcVar7);
        }
        std::ifstream::close();
        std::ofstream::close();
        poVar6 = std::operator<<((ostream *)&std::cout,"Done.");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        local_1 = 1;
        local_29c = 1;
        std::__cxx11::string::~string(local_718);
      }
      std::__cxx11::string::~string(local_6f0);
      std::ofstream::~ofstream(local_6d0);
    }
    std::ifstream::~ifstream(local_4d0);
    std::__cxx11::string::~string(local_2c8);
  }
  std::ifstream::~ifstream(local_298);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_58);
  return (bool)(local_1 & 1);
}

Assistant:

bool Generator::GenerateDart(const char* dir,int maxError,
                             bool group,std::string url,
                             double time,std::string basedirectory)
{
  std::cout << "Generating Dart...";

  // We try to find the TAG file
  std::string dirname = dir;
  if(dir[strlen(dir)-1] != '/' && dir[strlen(dir)-1] != '\\')
    {
     dirname += "/";
    }
  dirname += "Testing/";

  std::string tag = dirname+"TAG";

  std::ifstream tagfile;
  tagfile.open(tag.c_str(), std::ios::binary | std::ios::in);
  if(!tagfile.is_open())
    {
    std::cout << "Cannot open file for reading: " << tag.c_str() << std::endl;
    return false;
    }

  // We read the first line of the file which gives the path to the actual
  // directory
  char* bufferTag = new char[255];
  tagfile.getline(bufferTag,255);

  if(bufferTag[strlen(bufferTag)-1] == '\r')
    {
    bufferTag[strlen(bufferTag)-1] = '\0';
    }

  dirname += bufferTag;
  dirname += "/";

  delete [] bufferTag;

  // We should have a Configure.xml file in the directory
  std::string configname = dirname+"Configure.xml";

  std::ifstream configfile;

  configfile.open(configname.c_str(), std::ios::binary | std::ios::in);
  if(!configfile.is_open())
    {
    std::cout << "Cannot open file for reading: " << configname.c_str() << std::endl;
    return false;
    }

  // Create the Build.xml file
  std::ofstream file;
  std::string filename = dirname+"Build.xml";

  file.open(filename.c_str(), std::ios::binary | std::ios::out);
  if(!file.is_open())
    {
    std::cout << "Cannot open file for writing: " <<  std::endl;
    return false;
    }

  // Generate the header
  char* buffer = new char[255];
  configfile.getline(buffer,255);
  file << buffer << std::endl;
  configfile.getline(buffer,255);
  file << buffer << std::endl;

  std::string currentLine = buffer;
  while(currentLine.find(">") == std::string::npos)
   {
   configfile.getline(buffer,255);
   currentLine = buffer;
   file << buffer << std::endl;
   }

  delete [] buffer;

  file << "<Build>" << std::endl;
  file << "      <StartDateTime>";
  file << kwssys::SystemTools::GetCurrentDateTime("%b %d %H:%M:%S %z");
  file << "</StartDateTime>" << std::endl;
  file << "      <StartBuildTime>";
  file << static_cast<unsigned int>(kwssys::SystemTools::GetTime());
  file << "</StartBuildTime>" << std::endl;
  file << "<BuildCommand>KWStyle</BuildCommand>" << std::endl;

  int nErrors = 0;
  ParserVectorType::const_iterator it = m_Parsers->begin();
  while(it != m_Parsers->end())
    {
    std::string sourcefile = (*it).GetFilename();
    if (!basedirectory.empty()) {
      sourcefile = sourcefile.substr(basedirectory.size());
    }

    bool first = true;
    const Parser::ErrorVectorType errors = (*it).GetErrors();
    auto itError = errors.begin();
    while(itError != errors.end())
      {
      if((!group) || (first && group))
        {
        file << "<Error>" << std::endl;
        file << "          <BuildLogLine>1</BuildLogLine>" << std::endl;
        file << "          <SourceFile>";
        file << sourcefile.c_str();
        file << "</SourceFile>" << std::endl;
        file << "          <SourceLineNumber>";
        file << (*itError).line;
        file << "</SourceLineNumber>" << std::endl;

        if (!url.empty()) {
          // We had a link to the dashboard
          /*long int posslash = (*it).GetFilename().find_last_of("/");
          long int posbackslash = (*it).GetFilename().find_last_of("\\");

          long int pos = 0;
          if(posslash != -1 && posslash>posbackslash)
            {
            pos = posslash;
            }

          if(posbackslash != -1 && posbackslash>posslash)
            {
            pos = posbackslash;
            }

          if(pos == 0)
            {
            pos++;
            }
          std::string htmlfile = (*it).GetFilename().substr(pos+1,(*it).GetFilename().size()-pos-1);
          */

          std::string htmlfile = (*it).GetFilename();
          if(long int pos = htmlfile.find(":/") != std::string::npos)
            {
            htmlfile = htmlfile.substr(pos+2,htmlfile.size()-pos-2);
            }
          if(long int pos = htmlfile.find(":\\") != std::string::npos)
            {
            htmlfile = htmlfile.substr(pos+2,htmlfile.size()-pos-2);
            }

            auto slash = static_cast<long int>(htmlfile.find_last_of("/"));
            unsigned int i = 0;
            while (slash != -1 && i < m_MaxDirectoryDepth) {
              htmlfile.replace(slash, 1, "_");
              slash = static_cast<long int>(htmlfile.find_last_of("/"));
              i++;
            }
          slash = static_cast<long int>(htmlfile.find_last_of("/"));
          if(slash != -1)
            {
            htmlfile = htmlfile.substr(slash+1,htmlfile.size()-slash-1);
            }

          htmlfile += ".html";
          file << "<Url>"<< url.c_str() << "/" << htmlfile.c_str() << "</Url>" << std::endl;
          file << "<UrlName>View KWStyle File</UrlName>" << std::endl;
        }
        first = false;
        file << "          <Text>";
        }

      file << sourcefile.c_str();
      file << " : ";
      file << (*it).GetErrorTag((*itError).number);
      file << " : ";
      std::string desc = (*itError).description;
      auto pos = static_cast<long int>(desc.find("&", 0));
      while(pos != -1)
        {
        desc.replace(pos,1,"&amp;");
        pos = static_cast<long int>(desc.find("&",pos+3));
        }
      pos = static_cast<long int>(desc.find("<"));
      while(pos != -1)
        {
        desc.replace(pos,1,"&#x03C;");
        pos = static_cast<long int>(desc.find("<"));
        }
      pos = static_cast<long int>(desc.find(">"));
      while(pos != -1)
        {
        desc.replace(pos,1,"&#x03E;");
        pos = static_cast<long int>(desc.find(">"));
        }

      desc += " ["+(*it).GetTestDescription((*itError).number)+"] (";
      constexpr size_t length = 255;
      char* val = new char[length];
      snprintf(val,length,"%ld",(*itError).line);
      desc += val;
      desc += ")\n";
      delete [] val;

      file << desc;

      if(!group)
        {
        file << "</Text>" << std::endl;
        // Show the actual error in the precontext
        file << "          <PreContext>";
        //file << (*it).GetTestDescription((*itError).number) << std::endl;
        file << "</PreContext>" << std::endl;
        file << "<PostContext>";
        file << "</PostContext>" << std::endl;
        file << "<RepeatCount>0</RepeatCount>" << std::endl;
        file << "</Error>" << std::endl;
        }
      itError++;
      nErrors++;
      if((maxError != -1) && (nErrors >= maxError))
        {
        break;
        }
      }

    if(group && !first)
      {
      file << "</Text>" << std::endl;
      // Show the actual error in the precontext
      file << "          <PreContext>";
      //file << (*it).GetTestDescription((*itError).number) << std::endl;
      file << "</PreContext>" << std::endl;
      file << "<PostContext>";
      file << "</PostContext>" << std::endl;
      file << "<RepeatCount>0</RepeatCount>" << std::endl;
      file << "</Error>" << std::endl;
      }

    if((maxError != -1) && (nErrors >= maxError))
      {
      break;
      }
    it++;
    }

  // Write the footer
    file << R"( <Log Encoding="base64" Compression="/bin/gzip">)" << std::endl;
    file << "      </Log>" << std::endl;
    file << "      <EndDateTime>";
    file << kwssys::SystemTools::GetCurrentDateTime("%b %d %I:%M:%S %z");
    file << "</EndDateTime>" << std::endl;

    double time1 = kwssys::SystemTools::GetTime();

    constexpr size_t length = 10;
    char *timestr = new char[length];
    snprintf(timestr, length, "%.1f", (time1 - time) / 60.0);

    file << "  <ElapsedMinutes>" << timestr << "</ElapsedMinutes></Build>"
         << std::endl;
    file << "</Site>" << std::endl;

    delete[] timestr;
    configfile.close();
    file.close();
    std::cout << "Done." << std::endl;
    return true;
 }